

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clogger.h
# Opt level: O1

void __thiscall CLogger::Warn<char_const&>(CLogger *this,string_view fmt,char *args)

{
  source_loc loc;
  string_view_t fmt_00;
  logger *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  fmt_00.data_ = fmt._M_str;
  spdlog::get((spdlog *)&local_48,"rs");
  local_38 = 0;
  uStack_30 = 0;
  local_28 = 0;
  loc.funcname = (char *)0x0;
  loc.filename = (char *)0x0;
  loc.line = 0;
  loc._12_4_ = 0;
  fmt_00.size_ = fmt._M_len;
  spdlog::logger::log_<char_const&>(local_48,loc,warn,fmt_00,args);
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
  }
  return;
}

Assistant:

void Warn(std::string_view fmt, Args &&...args)
	{
		spdlog::get("rs")->warn(fmt, std::forward<Args>(args)...);
	}